

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_write_all(uv_fs_t *req)

{
  uv_buf_t *ptr;
  uint uVar1;
  size_t size;
  int *piVar2;
  size_t sVar3;
  bool bVar4;
  ssize_t result;
  ssize_t total;
  uv_buf_t *bufs;
  uint nbufs;
  uint iovmax;
  uv_fs_t *req_local;
  
  uVar1 = uv__getiovmax();
  bufs._0_4_ = req->nbufs;
  ptr = req->bufs;
  result = 0;
  do {
    if ((uint)bufs == 0) {
LAB_003807a2:
      if (ptr != req->bufsml) {
        uv__free(ptr);
      }
      req->bufs = (uv_buf_t *)0x0;
      req->nbufs = 0;
      return result;
    }
    req->nbufs = (uint)bufs;
    if (uVar1 < req->nbufs) {
      req->nbufs = uVar1;
    }
    do {
      size = uv__fs_write(req);
      bVar4 = false;
      if ((long)size < 0) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    if ((long)size < 1) {
      if (result == 0) {
        result = size;
      }
      goto LAB_003807a2;
    }
    if (-1 < req->off) {
      req->off = size + req->off;
    }
    sVar3 = uv__fs_buf_offset(req->bufs,size);
    req->nbufs = (uint)sVar3;
    req->bufs = req->bufs + req->nbufs;
    bufs._0_4_ = (uint)bufs - req->nbufs;
    result = size + result;
  } while( true );
}

Assistant:

static ssize_t uv__fs_write_all(uv_fs_t* req) {
  unsigned int iovmax;
  unsigned int nbufs;
  uv_buf_t* bufs;
  ssize_t total;
  ssize_t result;

  iovmax = uv__getiovmax();
  nbufs = req->nbufs;
  bufs = req->bufs;
  total = 0;

  while (nbufs > 0) {
    req->nbufs = nbufs;
    if (req->nbufs > iovmax)
      req->nbufs = iovmax;

    do
      result = uv__fs_write(req);
    while (result < 0 && errno == EINTR);

    if (result <= 0) {
      if (total == 0)
        total = result;
      break;
    }

    if (req->off >= 0)
      req->off += result;

    req->nbufs = uv__fs_buf_offset(req->bufs, result);
    req->bufs += req->nbufs;
    nbufs -= req->nbufs;
    total += result;
  }

  if (bufs != req->bufsml)
    uv__free(bufs);

  req->bufs = NULL;
  req->nbufs = 0;

  return total;
}